

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

void lysp_dev_node_free(lysc_ctx *cctx,lysp_node *dev_pnode)

{
  ushort uVar1;
  
  if (dev_pnode == (lysp_node *)0x0) {
    return;
  }
  uVar1 = dev_pnode->nodetype;
  if (uVar1 < 0x80) {
    if (uVar1 < 0x10) {
      switch(uVar1) {
      case 1:
        goto switchD_0014f51b_caseD_1;
      case 2:
        goto switchD_0014f51b_caseD_2;
      default:
switchD_0014f51b_caseD_3:
        ly_log(cctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
               ,0x71d);
        return;
      case 4:
      case 8:
        goto switchD_0014f51b_caseD_4;
      }
    }
    if (uVar1 != 0x10) {
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) goto switchD_0014f51b_caseD_3;
      goto switchD_0014f51b_caseD_4;
    }
switchD_0014f51b_caseD_1:
    dev_pnode[1].ref = (char *)0x0;
    dev_pnode[1].iffeatures = (lysp_qname *)0x0;
    dev_pnode[1].exts = (lysp_ext_instance *)0x0;
  }
  else {
    if (0x3ff < uVar1) {
      if (uVar1 != 0x400) {
        if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
          dev_pnode[1].name = (char *)0x0;
          lysp_node_free(&cctx->free_ctx,dev_pnode);
          free(dev_pnode);
          return;
        }
        goto switchD_0014f51b_caseD_3;
      }
      dev_pnode[1].name = (char *)0x0;
      goto switchD_0014f51b_caseD_4;
    }
    if (uVar1 != 0x80) {
      if ((uVar1 != 0x100) && (uVar1 != 0x200)) goto switchD_0014f51b_caseD_3;
      dev_pnode[2].ref = (char *)0x0;
      dev_pnode[4].nodetype = 0;
      dev_pnode[4].flags = 0;
      *(undefined4 *)&dev_pnode[4].field_0xc = 0;
      goto switchD_0014f51b_caseD_4;
    }
switchD_0014f51b_caseD_2:
    dev_pnode[1].parent = (lysp_node *)0x0;
  }
switchD_0014f51b_caseD_4:
  lysp_node_free(&cctx->free_ctx,dev_pnode);
  return;
}

Assistant:

void
lysp_dev_node_free(struct lysc_ctx *cctx, struct lysp_node *dev_pnode)
{
    if (!dev_pnode) {
        return;
    }

    switch (dev_pnode->nodetype) {
    case LYS_CONTAINER:
        ((struct lysp_node_container *)dev_pnode)->child = NULL;
        ((struct lysp_node_container *)dev_pnode)->actions = NULL;
        ((struct lysp_node_container *)dev_pnode)->notifs = NULL;
        break;
    case LYS_LIST:
        ((struct lysp_node_list *)dev_pnode)->child = NULL;
        ((struct lysp_node_list *)dev_pnode)->actions = NULL;
        ((struct lysp_node_list *)dev_pnode)->notifs = NULL;
        break;
    case LYS_CHOICE:
        ((struct lysp_node_choice *)dev_pnode)->child = NULL;
        break;
    case LYS_CASE:
        ((struct lysp_node_case *)dev_pnode)->child = NULL;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* no children */
        break;
    case LYS_NOTIF:
        ((struct lysp_node_notif *)dev_pnode)->child = NULL;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        ((struct lysp_node_action *)dev_pnode)->input.child = NULL;
        ((struct lysp_node_action *)dev_pnode)->output.child = NULL;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        ((struct lysp_node_action_inout *)dev_pnode)->child = NULL;
        lysp_node_free(&cctx->free_ctx, dev_pnode);
        free(dev_pnode);
        return;
    default:
        LOGINT(cctx->ctx);
        return;
    }

    lysp_node_free(&cctx->free_ctx, dev_pnode);
}